

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_player_spells(void)

{
  char *message;
  wchar_t wVar1;
  ulong uVar2;
  long lVar3;
  uint16_t tmp16u;
  ushort local_1a;
  
  rd_u16b(&local_1a);
  if ((player->class->magic).total_spells < (int)(uint)local_1a) {
    message = format("Too many player spells (%d).");
    note(message);
    wVar1 = L'\xffffffff';
  }
  else {
    player_spells_init(player);
    if (local_1a != 0) {
      uVar2 = 0;
      do {
        rd_byte(player->spell_flags + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_1a);
    }
    if (local_1a == 0) {
      wVar1 = L'\0';
    }
    else {
      wVar1 = L'\0';
      lVar3 = 0;
      do {
        rd_byte(player->spell_order + lVar3);
        lVar3 = lVar3 + 1;
      } while ((uint)lVar3 < (uint)local_1a);
    }
  }
  return wVar1;
}

Assistant:

int rd_player_spells(void)
{
	int i;
	uint16_t tmp16u;
	
	int cnt;
	
	/* Read the number of spells */
	rd_u16b(&tmp16u);
	if (tmp16u > player->class->magic.total_spells) {
		note(format("Too many player spells (%d).", tmp16u));
		return (-1);
	}

	/* Initialise */
	player_spells_init(player);
	
	/* Read the spell flags */
	for (i = 0; i < tmp16u; i++)
		rd_byte(&player->spell_flags[i]);
	
	/* Read the spell order */
	for (i = 0, cnt = 0; i < tmp16u; i++, cnt++)
		rd_byte(&player->spell_order[cnt]);
	
	/* Success */
	return (0);
}